

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O3

int run_test_pipe_bind_error_addrnotavail(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  uv_loop_t *unaff_RBX;
  undefined1 *puVar4;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t server;
  undefined1 auStack_1098 [16];
  uv_loop_t *puStack_1088;
  uv_connect_t uStack_1080;
  uv_pipe_t uStack_1018;
  long alStack_f30 [64];
  uv_loop_t *puStack_d30;
  long lStack_d20;
  long lStack_d18;
  undefined1 auStack_d10 [264];
  uv_pipe_t uStack_c08;
  uv_loop_t auStack_b20 [2];
  undefined1 uStack_321;
  uv_loop_t *puStack_320;
  long lStack_310;
  long lStack_308;
  uv_pipe_t uStack_300;
  uv_loop_t *puStack_218;
  long lStack_208;
  long lStack_200;
  uv_pipe_t uStack_1f8;
  uv_loop_t *puStack_110;
  long local_100;
  long local_f8;
  uv_pipe_t local_f0;
  
  puStack_110 = (uv_loop_t *)0x1ac880;
  puVar2 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1ac88f;
  iVar1 = uv_pipe_init(puVar2,&local_f0,0);
  local_f8 = (long)iVar1;
  local_100 = 0;
  if (local_f8 == 0) {
    puStack_110 = (uv_loop_t *)0x1ac8c0;
    iVar1 = uv_pipe_bind(&local_f0,"/path/to/unix/socket/that/really/should/not/be/there");
    local_f8 = (long)iVar1;
    local_100 = -0xd;
    if (local_f8 != -0xd) goto LAB_001ac98c;
    puStack_110 = (uv_loop_t *)0x1ac8f1;
    uv_close((uv_handle_t *)&local_f0,close_cb);
    puStack_110 = (uv_loop_t *)0x1ac8f6;
    puVar2 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1ac900;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_f8 = 1;
    local_100 = (long)close_cb_called;
    if (local_100 != 1) goto LAB_001ac99b;
    puStack_110 = (uv_loop_t *)0x1ac926;
    unaff_RBX = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1ac93a;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_110 = (uv_loop_t *)0x1ac944;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_f8 = 0;
    puStack_110 = (uv_loop_t *)0x1ac952;
    puVar2 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1ac95a;
    iVar1 = uv_loop_close(puVar2);
    local_100 = (long)iVar1;
    if (local_f8 == local_100) {
      puStack_110 = (uv_loop_t *)0x1ac972;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_110 = (uv_loop_t *)0x1ac98c;
    run_test_pipe_bind_error_addrnotavail_cold_1();
LAB_001ac98c:
    puStack_110 = (uv_loop_t *)0x1ac99b;
    run_test_pipe_bind_error_addrnotavail_cold_2();
LAB_001ac99b:
    puStack_110 = (uv_loop_t *)0x1ac9aa;
    run_test_pipe_bind_error_addrnotavail_cold_3();
  }
  puStack_110 = (uv_loop_t *)run_test_pipe_bind_error_inval;
  run_test_pipe_bind_error_addrnotavail_cold_4();
  puStack_218 = (uv_loop_t *)0x1ac9c6;
  puStack_110 = unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_218 = (uv_loop_t *)0x1ac9d5;
  iVar1 = uv_pipe_init(puVar2,&uStack_1f8,0);
  lStack_200 = (long)iVar1;
  lStack_208 = 0;
  if (lStack_200 == 0) {
    puStack_218 = (uv_loop_t *)0x1aca06;
    iVar1 = uv_pipe_bind(&uStack_1f8,"/tmp/uv-test-sock");
    lStack_200 = (long)iVar1;
    lStack_208 = 0;
    if (lStack_200 != 0) goto LAB_001acb07;
    puStack_218 = (uv_loop_t *)0x1aca37;
    iVar1 = uv_pipe_bind(&uStack_1f8,"/tmp/uv-test-sock2");
    lStack_200 = (long)iVar1;
    lStack_208 = -0x16;
    if (lStack_200 != -0x16) goto LAB_001acb16;
    puStack_218 = (uv_loop_t *)0x1aca68;
    uv_close((uv_handle_t *)&uStack_1f8,close_cb);
    puStack_218 = (uv_loop_t *)0x1aca6d;
    puVar2 = uv_default_loop();
    puStack_218 = (uv_loop_t *)0x1aca77;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_200 = 1;
    lStack_208 = (long)close_cb_called;
    if (lStack_208 != 1) goto LAB_001acb25;
    puStack_218 = (uv_loop_t *)0x1acaa1;
    unaff_RBX = uv_default_loop();
    puStack_218 = (uv_loop_t *)0x1acab5;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_218 = (uv_loop_t *)0x1acabf;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_200 = 0;
    puStack_218 = (uv_loop_t *)0x1acacd;
    puVar2 = uv_default_loop();
    puStack_218 = (uv_loop_t *)0x1acad5;
    iVar1 = uv_loop_close(puVar2);
    lStack_208 = (long)iVar1;
    if (lStack_200 == lStack_208) {
      puStack_218 = (uv_loop_t *)0x1acaed;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_218 = (uv_loop_t *)0x1acb07;
    run_test_pipe_bind_error_inval_cold_1();
LAB_001acb07:
    puStack_218 = (uv_loop_t *)0x1acb16;
    run_test_pipe_bind_error_inval_cold_2();
LAB_001acb16:
    puStack_218 = (uv_loop_t *)0x1acb25;
    run_test_pipe_bind_error_inval_cold_3();
LAB_001acb25:
    puStack_218 = (uv_loop_t *)0x1acb34;
    run_test_pipe_bind_error_inval_cold_4();
  }
  puStack_218 = (uv_loop_t *)run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  puStack_320 = (uv_loop_t *)0x1acb50;
  puStack_218 = unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_320 = (uv_loop_t *)0x1acb5f;
  iVar1 = uv_pipe_init(puVar2,&uStack_300,0);
  lStack_308 = (long)iVar1;
  lStack_310 = 0;
  if (lStack_308 == 0) {
    puStack_320 = (uv_loop_t *)0x1acb90;
    iVar1 = uv_listen((uv_stream_t *)&uStack_300,0x1000,(uv_connection_cb)0x0);
    lStack_308 = (long)iVar1;
    lStack_310 = -0x16;
    if (lStack_308 != -0x16) goto LAB_001acc5c;
    puStack_320 = (uv_loop_t *)0x1acbc1;
    uv_close((uv_handle_t *)&uStack_300,close_cb);
    puStack_320 = (uv_loop_t *)0x1acbc6;
    puVar2 = uv_default_loop();
    puStack_320 = (uv_loop_t *)0x1acbd0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_308 = 1;
    lStack_310 = (long)close_cb_called;
    if (lStack_310 != 1) goto LAB_001acc6b;
    puStack_320 = (uv_loop_t *)0x1acbf6;
    unaff_RBX = uv_default_loop();
    puStack_320 = (uv_loop_t *)0x1acc0a;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_320 = (uv_loop_t *)0x1acc14;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_308 = 0;
    puStack_320 = (uv_loop_t *)0x1acc22;
    puVar2 = uv_default_loop();
    puStack_320 = (uv_loop_t *)0x1acc2a;
    iVar1 = uv_loop_close(puVar2);
    lStack_310 = (long)iVar1;
    if (lStack_308 == lStack_310) {
      puStack_320 = (uv_loop_t *)0x1acc42;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_320 = (uv_loop_t *)0x1acc5c;
    run_test_pipe_listen_without_bind_cold_1();
LAB_001acc5c:
    puStack_320 = (uv_loop_t *)0x1acc6b;
    run_test_pipe_listen_without_bind_cold_2();
LAB_001acc6b:
    puStack_320 = (uv_loop_t *)0x1acc7a;
    run_test_pipe_listen_without_bind_cold_3();
  }
  puStack_320 = (uv_loop_t *)run_test_pipe_bind_error_long_path;
  run_test_pipe_listen_without_bind_cold_4();
  puVar2 = auStack_b20;
  auStack_d10._232_8_ = (uv_close_cb)0x1accab;
  puStack_320 = unaff_RBX;
  memset(puVar2,0x2e,0x7ff);
  uStack_321 = 0;
  auStack_d10._232_8_ = (uv_close_cb)0x1accb7;
  puVar3 = uv_default_loop();
  auStack_d10._232_8_ = (uv_close_cb)0x1accc6;
  iVar1 = uv_pipe_init(puVar3,(uv_pipe_t *)(auStack_d10 + 0x108),0);
  if (iVar1 == 0) {
    auStack_d10._232_8_ = (uv_close_cb)0x1acce0;
    iVar1 = uv_pipe_bind((uv_pipe_t *)(auStack_d10 + 0x108),(char *)auStack_b20);
    if (iVar1 != -0x24) goto LAB_001acd73;
    auStack_d10._232_8_ = (uv_close_cb)0x1accfa;
    uv_close((uv_handle_t *)(auStack_d10 + 0x108),close_cb);
    auStack_d10._232_8_ = (uv_close_cb)0x1accff;
    puVar3 = uv_default_loop();
    auStack_d10._232_8_ = (uv_close_cb)0x1acd09;
    uv_run(puVar3,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_001acd78;
    auStack_d10._232_8_ = (uv_close_cb)0x1acd17;
    puVar2 = uv_default_loop();
    auStack_d10._232_8_ = (uv_close_cb)0x1acd2b;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    auStack_d10._232_8_ = (uv_close_cb)0x1acd35;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_d10._256_8_ = (uv_handle_t *)0x0;
    auStack_d10._232_8_ = (uv_close_cb)0x1acd43;
    puVar3 = uv_default_loop();
    auStack_d10._232_8_ = (uv_close_cb)0x1acd4b;
    iVar1 = uv_loop_close(puVar3);
    auStack_d10._248_8_ = SEXT48(iVar1);
    if (auStack_d10._256_8_ == auStack_d10._248_8_) {
      auStack_d10._232_8_ = (uv_close_cb)0x1acd63;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_d10._232_8_ = (uv_close_cb)0x1acd73;
    run_test_pipe_bind_error_long_path_cold_1();
LAB_001acd73:
    auStack_d10._232_8_ = (uv_close_cb)0x1acd78;
    run_test_pipe_bind_error_long_path_cold_2();
LAB_001acd78:
    auStack_d10._232_8_ = (uv_close_cb)0x1acd7d;
    run_test_pipe_bind_error_long_path_cold_3();
  }
  auStack_d10._232_8_ = run_test_pipe_bind_or_listen_error_after_close;
  run_test_pipe_bind_error_long_path_cold_4();
  puStack_d30 = (uv_loop_t *)0x1acd99;
  auStack_d10._232_8_ = puVar2;
  puVar3 = uv_default_loop();
  puStack_d30 = (uv_loop_t *)0x1acda8;
  iVar1 = uv_pipe_init(puVar3,(uv_pipe_t *)auStack_d10,0);
  lStack_d18 = (long)iVar1;
  lStack_d20 = 0;
  if (lStack_d18 == 0) {
    puVar2 = (uv_loop_t *)auStack_d10;
    puStack_d30 = (uv_loop_t *)0x1acdd7;
    uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
    puStack_d30 = (uv_loop_t *)0x1acde6;
    iVar1 = uv_pipe_bind((uv_pipe_t *)puVar2,"/tmp/uv-test-sock");
    lStack_d18 = (long)iVar1;
    lStack_d20 = -0x16;
    if (lStack_d18 != -0x16) goto LAB_001aced1;
    puStack_d30 = (uv_loop_t *)0x1ace17;
    iVar1 = uv_listen((uv_stream_t *)auStack_d10,0x1000,(uv_connection_cb)0x0);
    lStack_d18 = (long)iVar1;
    lStack_d20 = -0x16;
    if (lStack_d18 != -0x16) goto LAB_001acee0;
    puStack_d30 = (uv_loop_t *)0x1ace3c;
    puVar3 = uv_default_loop();
    puStack_d30 = (uv_loop_t *)0x1ace46;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_d18 = (long)iVar1;
    lStack_d20 = 0;
    if (lStack_d18 != 0) goto LAB_001aceef;
    puStack_d30 = (uv_loop_t *)0x1ace6b;
    puVar2 = uv_default_loop();
    puStack_d30 = (uv_loop_t *)0x1ace7f;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    puStack_d30 = (uv_loop_t *)0x1ace89;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_d18 = 0;
    puStack_d30 = (uv_loop_t *)0x1ace97;
    puVar3 = uv_default_loop();
    puStack_d30 = (uv_loop_t *)0x1ace9f;
    iVar1 = uv_loop_close(puVar3);
    lStack_d20 = (long)iVar1;
    if (lStack_d18 == lStack_d20) {
      puStack_d30 = (uv_loop_t *)0x1aceb7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_d30 = (uv_loop_t *)0x1aced1;
    run_test_pipe_bind_or_listen_error_after_close_cold_1();
LAB_001aced1:
    puStack_d30 = (uv_loop_t *)0x1acee0;
    run_test_pipe_bind_or_listen_error_after_close_cold_2();
LAB_001acee0:
    puStack_d30 = (uv_loop_t *)0x1aceef;
    run_test_pipe_bind_or_listen_error_after_close_cold_3();
LAB_001aceef:
    puStack_d30 = (uv_loop_t *)0x1acefe;
    run_test_pipe_bind_or_listen_error_after_close_cold_4();
  }
  puStack_d30 = (uv_loop_t *)run_test_pipe_overlong_path;
  run_test_pipe_bind_or_listen_error_after_close_cold_5();
  puVar4 = auStack_1098 + 8;
  auStack_1098._0_8_ = (void *)0x1acf1a;
  puStack_d30 = puVar2;
  puVar2 = uv_default_loop();
  auStack_1098._0_8_ = (void *)0x1acf29;
  iVar1 = uv_pipe_init(puVar2,&uStack_1018,0);
  alStack_f30[0] = (long)iVar1;
  uStack_1080.data = (uv_loop_t *)0x0;
  if (alStack_f30[0] == 0) {
    auStack_1098._0_8_ = (void *)0x1acf69;
    memset(alStack_f30,0x40,0x200);
    uStack_1080.data = (uv_loop_t *)0xffffffffffffffdc;
    auStack_1098._0_8_ = (void *)0x1acf89;
    iVar1 = uv_pipe_bind2(&uStack_1018,(char *)alStack_f30,0x200,1);
    auStack_1098._8_8_ = SEXT48(iVar1);
    if (uStack_1080.data != (void *)auStack_1098._8_8_) goto LAB_001ad13d;
    auStack_1098._8_8_ = (uv_loop_t *)0xffffffffffffffdc;
    auStack_1098._0_8_ = (void *)0x1acfcf;
    iVar1 = uv_pipe_connect2(&uStack_1080,&uStack_1018,(char *)alStack_f30,0x200,1,abort);
    puStack_1088 = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_1098._8_8_ != puStack_1088) goto LAB_001ad14a;
    auStack_1098._0_8_ = (void *)0x1acfea;
    puVar2 = uv_default_loop();
    auStack_1098._0_8_ = (void *)0x1acff4;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_1098._8_8_ = SEXT48(iVar1);
    puStack_1088 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1098._8_8_ != (uv_loop_t *)0x0) goto LAB_001ad157;
    auStack_1098._8_8_ = (uv_loop_t *)0xffffffffffffffea;
    auStack_1098._0_8_ = (void *)0x1ad02b;
    iVar1 = uv_pipe_bind(&uStack_1018,"");
    puStack_1088 = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_1098._8_8_ != puStack_1088) goto LAB_001ad164;
    auStack_1098._0_8_ = (void *)0x1ad05e;
    uv_pipe_connect(&uStack_1080,&uStack_1018,"",connect_overlong_cb);
    auStack_1098._0_8_ = (void *)0x1ad063;
    puVar2 = uv_default_loop();
    auStack_1098._0_8_ = (void *)0x1ad06d;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_1098._8_8_ = SEXT48(iVar1);
    puStack_1088 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1098._8_8_ != (uv_loop_t *)0x0) goto LAB_001ad171;
    auStack_1098._8_8_ = (uv_loop_t *)0x1;
    puStack_1088 = (uv_loop_t *)(long)connect_cb_called;
    if (puStack_1088 != (uv_loop_t *)0x1) goto LAB_001ad17e;
    auStack_1098._8_8_ = (uv_loop_t *)0x1;
    puStack_1088 = (uv_loop_t *)(long)close_cb_called;
    if (puStack_1088 == (uv_loop_t *)0x1) {
      auStack_1098._0_8_ = (void *)0x1ad0d6;
      puVar2 = uv_default_loop();
      auStack_1098._0_8_ = (void *)0x1ad0ea;
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      auStack_1098._0_8_ = (void *)0x1ad0f4;
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_1098._8_8_ = (uv_loop_t *)0x0;
      auStack_1098._0_8_ = (void *)0x1ad101;
      puVar2 = uv_default_loop();
      auStack_1098._0_8_ = (void *)0x1ad109;
      iVar1 = uv_loop_close(puVar2);
      puStack_1088 = (uv_loop_t *)(long)iVar1;
      if ((uv_loop_t *)auStack_1098._8_8_ == puStack_1088) {
        auStack_1098._0_8_ = (void *)0x1ad120;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ad198;
    }
  }
  else {
    auStack_1098._0_8_ = (void *)0x1ad13d;
    run_test_pipe_overlong_path_cold_1();
LAB_001ad13d:
    auStack_1098._0_8_ = (void *)0x1ad14a;
    run_test_pipe_overlong_path_cold_2();
LAB_001ad14a:
    auStack_1098._0_8_ = (void *)0x1ad157;
    run_test_pipe_overlong_path_cold_3();
LAB_001ad157:
    auStack_1098._0_8_ = (void *)0x1ad164;
    run_test_pipe_overlong_path_cold_4();
LAB_001ad164:
    auStack_1098._0_8_ = (void *)0x1ad171;
    run_test_pipe_overlong_path_cold_5();
LAB_001ad171:
    auStack_1098._0_8_ = (void *)0x1ad17e;
    run_test_pipe_overlong_path_cold_6();
LAB_001ad17e:
    auStack_1098._0_8_ = (void *)0x1ad18b;
    run_test_pipe_overlong_path_cold_7();
  }
  auStack_1098._0_8_ = (void *)0x1ad198;
  run_test_pipe_overlong_path_cold_8();
LAB_001ad198:
  iVar1 = (int)&puStack_1088;
  auStack_1098._0_8_ = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  auStack_1098._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_1098._0_8_ == (void *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    uv_close(*(uv_handle_t **)(puVar4 + 0x50),close_cb);
    return extraout_EAX;
  }
  handle = (uv_handle_t *)auStack_1098;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(pipe_bind_error_addrnotavail) {
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&server, BAD_PIPENAME);
  ASSERT_EQ(r, UV_EACCES);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}